

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f699::CtorEvalExternalInterface::applyToModule(CtorEvalExternalInterface *this)

{
  __node_base_ptr *pp_Var1;
  char **this_00;
  Module *pMVar2;
  pointer puVar3;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var4;
  _Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> _Var5;
  pointer puVar6;
  key_type *__k;
  element_type *peVar7;
  _Hash_node_base *p_Var8;
  _Head_base<0UL,_wasm::Export_*,_false> _Var9;
  __node_base_ptr p_Var10;
  pointer puVar11;
  undefined1 auVar12 [8];
  char *pcVar13;
  Const *pCVar14;
  long lVar15;
  mapped_type *__x;
  Expression *pEVar16;
  _Head_base<0UL,_wasm::Export_*,_false> _Var17;
  iterator iVar18;
  InsertOrderedSet<wasm::Name> *this_01;
  bool isPassive;
  pointer pTVar19;
  size_t sVar20;
  _Hash_node_base *p_Var21;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *oldGlobal;
  Export *pEVar22;
  undefined1 auVar23 [16];
  string_view sVar24;
  Name name;
  Name NVar25;
  Name memory;
  Name possibleDefiningGlobal;
  Name global;
  Builder builder;
  __node_base_ptr p_Stack_1f8;
  _List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
  local_1f0;
  undefined1 auStack_1d8 [8];
  InitScanner scanner;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  local_a8;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_90 [3];
  undefined1 auStack_78 [8];
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> curr;
  __node_base_ptr p_Stack_48;
  Module *local_38;
  
  std::
  _Hashtable<wasm::GCData_*,_std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>,_std::allocator<std::pair<wasm::GCData_*const,_(anonymous_namespace)::CtorEvalExternalInterface::DefiningGlobalInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GCData_*>,_std::hash<wasm::GCData_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->definingGlobals)._M_h);
  if ((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_engaged == true) {
    (((this->startBlock).super__Optional_base<wasm::Block_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Block_*>._M_payload._M_value)->list).
    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements = 0;
  }
  local_38 = (Module *)this;
  if ((this->memories)._M_h._M_element_count != 0) {
    pMVar2 = this->wasm;
    puVar3 = (pMVar2->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar2->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pMVar2->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      global.super_IString.str._M_str = (char *)pMVar2;
      auVar23 = wasm::IString::interned(0,"",0);
      memory.super_IString.str._M_len = auVar23._8_8_;
      pcVar13 = (char *)wasm::IString::interned(0,"",0);
      this = (CtorEvalExternalInterface *)local_38;
      name.super_IString.str._M_str = auVar23._0_8_;
      name.super_IString.str._M_len = (size_t)auStack_78;
      memory.super_IString.str._M_str = pcVar13;
      wasm::Builder::makeDataSegment
                (name,memory,isPassive,(Expression *)0x0,(char *)0x0,(Address)0x16019f);
      wasm::Literal::makeFromInt32
                ((Literal *)auStack_1d8,0,
                 (Type)*(uintptr_t *)
                        ((long)(puVar3->_M_t).
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t + 0x50));
      pCVar14 = wasm::Builder::makeConst
                          ((Builder *)&global.super_IString.str._M_str,(Literal *)auStack_1d8);
      *(Const **)((long)auStack_78 + 0x30) = pCVar14;
      wasm::Literal::~Literal((Literal *)auStack_1d8);
      auVar12 = auStack_78;
      sVar24 = (string_view)wasm::Name::fromInt(0);
      (((Named *)auVar12)->name).super_IString.str = sVar24;
      ((Named *)auVar12)->hasExplicitName = false;
      _Var4._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (puVar3->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
           _M_t;
      pcVar13 = *(char **)((long)_Var4._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
      (((Name *)((long)auStack_78 + 0x18))->super_IString).str._M_len =
           *(size_t *)
            _Var4._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      (((Name *)((long)auStack_78 + 0x18))->super_IString).str._M_str = pcVar13;
      wasm::Module::addDataSegment
                ((unique_ptr *)
                 (((Module *)this)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      if (auStack_78 != (undefined1  [8])0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)auStack_78,(DataSegment *)auStack_78);
      }
    }
    _Var5.super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
         (((Module *)this)->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[0x12]._M_t.
         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>;
    if (**(char **)(*(long *)_Var5.super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x30)
        != '\x0e') {
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,"T *wasm::Expression::cast() [T = wasm::Const]");
    }
    lVar15 = wasm::Literal::getInteger();
    if (lVar15 != 0) {
      __assert_fail("segment->offset->cast<Const>()->value.getInteger() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                    ,0x20b,
                    "void (anonymous namespace)::CtorEvalExternalInterface::applyMemoryToModule()");
    }
    __x = std::__detail::
          _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        *)&((Module *)this)->tags,
                       (key_type *)
                       (puVar3->_M_t).
                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t)
    ;
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)
               (*(long *)_Var5.super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x38),__x
              );
  }
  puVar6 = (((Module *)this)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((ulong)puVar6[0x2f]._M_t.
              super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl & 0x400) == 0) {
    puVar6 = (((Module *)this)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    for (_Var17._M_head_impl =
              puVar6[8]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
              ._M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        _Var17._M_head_impl != (Export *)(puVar6 + 6);
        _Var17._M_head_impl = (Export *)std::_Rb_tree_increment(_Var17._M_head_impl)) {
      pEVar16 = getSerialization(this,(Literals *)(_Var17._M_head_impl + 1),(Name)ZEXT816(0));
      NVar25.super_IString.str._M_str =
           ((_Var17._M_head_impl)->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
           super_IString.str._M_str;
      NVar25.super_IString.str._M_len =
           (size_t)(((Module *)this)->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      lVar15 = wasm::Module::getGlobal(NVar25);
      *(Expression **)(lVar15 + 0x40) = pEVar16;
    }
  }
  else {
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &puVar6[6]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>;
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)
          &puVar6[7]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>;
    local_a8.
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)
          &puVar6[8]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
           super__Head_base<0UL,_wasm::Export_*,_false>;
    puVar6[6]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false> = (_Head_base<0UL,_wasm::Export_*,_false>)0x0;
    puVar6[7]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false> = (_Head_base<0UL,_wasm::Export_*,_false>)0x0;
    puVar6[8]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
    super__Head_base<0UL,_wasm::Export_*,_false> = (_Head_base<0UL,_wasm::Export_*,_false>)0x0;
    wasm::Module::updateMaps();
    puVar11 = local_a8.
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pEVar22 = (Export *)
                   local_a8.
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pEVar22 != (Export *)puVar11;
        pEVar22 = (Export *)&(pEVar22->name).super_IString.str._M_str) {
      __k = (key_type *)(pEVar22->name).super_IString.str._M_len;
      if ((*(char *)&__k[4].super_IString.str._M_str == '\0') &&
         (__k[3].super_IString.str._M_str == *(char **)(__k[4].super_IString.str._M_len + 8))) {
        sVar20 = (__k->super_IString).str._M_len;
        pcVar13 = (__k->super_IString).str._M_str;
      }
      else {
        pcVar13 = (char *)0x0;
        sVar20 = 0;
      }
      iVar18 = std::
               _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               ::find((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                       *)((((Module *)this)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),__k);
      if (iVar18._M_node !=
          (_Base_ptr)
          ((((Module *)this)->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6)) {
        possibleDefiningGlobal.super_IString.str._M_str = pcVar13;
        possibleDefiningGlobal.super_IString.str._M_len = sVar20;
        pEVar16 = getSerialization(this,(Literals *)&iVar18._M_node[1]._M_left,
                                   possibleDefiningGlobal);
        *(Expression **)((pEVar22->name).super_IString.str._M_len + 0x40) = pEVar16;
      }
      wasm::Module::addGlobal
                ((unique_ptr *)
                 (((Module *)this)->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    global.super_IString.str._M_str = (char *)&p_Stack_1f8;
    p_Stack_1f8 = (__node_base_ptr)0x0;
    local_1f0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_1f0;
    local_1f0._M_impl._M_node._M_size = 0;
    puVar6 = (((Module *)this)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var17._M_head_impl =
         puVar6[6]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    scanner.unfixableGets.List.
    super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node._M_size
         = *(size_t *)
            &puVar6[7]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>;
    local_1f0._M_impl._M_node.super__List_node_base._M_prev =
         local_1f0._M_impl._M_node.super__List_node_base._M_next;
    if (_Var17._M_head_impl !=
        (Export *)
        scanner.unfixableGets.List.
        super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
        _M_size) {
      pp_Var1 = &scanner.unfixableGets.Map._M_h._M_single_bucket;
      this_00 = &global.super_IString.str._M_str;
      do {
        if (*(long *)(*(long *)&((_Var17._M_head_impl)->name).super_IString + 0x40) != 0) {
          auStack_1d8 = (undefined1  [8])0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0
          ;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
               (Function *)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp
               = (Expression **)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule =
               (Module *)&scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize;
          scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)0x1;
          scanner.unfixableGets.Map._M_h._M_bucket_count = 0;
          scanner.unfixableGets.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          scanner.unfixableGets.Map._M_h._M_element_count._0_4_ = 0x3f800000;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._4_4_ = 0;
          scanner.unfixableGets.Map._M_h._M_rehash_policy._M_next_resize = 0;
          scanner.unfixableGets.List.
          super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
          super__List_node_base._M_prev = (_List_node_base *)0x0;
          scanner.unfixableGets.Map._M_h._M_single_bucket = (__node_base_ptr)pp_Var1;
          scanner.unfixableGets.List.
          super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)pp_Var1;
          wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::pushTask
                    ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)auStack_1d8,
                     wasm::PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::scan,
                     (Expression **)(*(long *)&((_Var17._M_head_impl)->name).super_IString + 0x40));
          while (p_Var21 = scanner.unfixableGets.Map._M_h._M_single_bucket,
                ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                       super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                 (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                       _M_elems[9].currp >> 4) +
                (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
            pTVar19 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                      super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar13 = 
                "T &wasm::SmallVector<wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, 10>::back() [T = wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, N = 10]"
                ;
                goto LAB_001439eb;
              }
              pTVar19 = (pointer)&scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems
                                  [(long)scanner.
                                         super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                         .
                                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                         .replacep + -1].currp;
            }
            peVar7 = (element_type *)pTVar19[-1].currp;
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar13 = 
                "void wasm::SmallVector<wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, 10>::pop_back() [T = wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::Task, N = 10]"
                ;
                goto LAB_001439cc;
              }
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                   (Expression **)
                   ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1
                   );
            }
            else {
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
            }
            auStack_1d8 = (undefined1  [8])peVar7;
            if ((Expression *)(peVar7->tag).super_IString.str._M_len == (Expression *)0x0) {
              pcVar13 = 
              "void wasm::Walker<InitScanner, wasm::Visitor<InitScanner>>::walk(Expression *&) [SubType = InitScanner, VisitorType = wasm::Visitor<InitScanner>]"
              ;
              goto LAB_0014397f;
            }
            (*pTVar19[-1].func)((InitScanner *)auStack_1d8,(Expression **)peVar7);
          }
          for (; p_Var10 = scanner.unfixableGets.Map._M_h._M_single_bucket,
              p_Var21 != (_Hash_node_base *)pp_Var1; p_Var21 = p_Var21->_M_nxt) {
            p_Var8 = p_Var21[2]._M_nxt;
            wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::operator[]
                      ((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_> *)this_00,
                       *(Name **)&((_Var17._M_head_impl)->name).super_IString);
            this_01 = wasm::InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>::
                      operator[]((InsertOrderedMap<wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>
                                  *)this_00,(Name *)(p_Var8 + 2));
            wasm::InsertOrderedSet<wasm::Name>::insert
                      (this_01,*(Name **)&((_Var17._M_head_impl)->name).super_IString);
          }
          while (p_Var10 != (__node_base_ptr)pp_Var1) {
            p_Var21 = p_Var10->_M_nxt;
            operator_delete(p_Var10,0x18);
            p_Var10 = p_Var21;
          }
          std::
          _Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<wasm::GlobalGet_*,_std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>,_std::allocator<std::pair<wasm::GlobalGet_*const,_std::_List_iterator<wasm::GlobalGet_*>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::GlobalGet_*>,_std::hash<wasm::GlobalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule
                       );
          this = (CtorEvalExternalInterface *)local_38;
          if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].
              currp != (Expression **)0x0) {
            operator_delete(scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems[9].currp,
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .flexible.
                                  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems[9].currp);
          }
        }
        _Var17._M_head_impl = (Export *)&((_Var17._M_head_impl)->name).super_IString.str._M_str;
      } while (_Var17._M_head_impl !=
               (Export *)
               scanner.unfixableGets.List.
               super__List_base<wasm::GlobalGet_*,_std::allocator<wasm::GlobalGet_*>_>._M_impl.
               _M_node._M_size);
    }
    auStack_78 = (undefined1  [8])&stack0xffffffffffffffb8;
    curr._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
    .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
    super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         (__uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>)0x1;
    p_Stack_48 = (__node_base_ptr)0x0;
    puVar6 = (((Module *)this)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var17._M_head_impl =
         puVar6[6]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    _Var9._M_head_impl =
         puVar6[7]._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (_Var17._M_head_impl != _Var9._M_head_impl) {
      do {
        if (*(long *)(*(long *)&((_Var17._M_head_impl)->name).super_IString.str + 0x40) != 0) {
          auStack_1d8 = (undefined1  [8])0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)0x0
          ;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp
               = (Expression **)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule = local_38;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
               (Function *)
               (local_38->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          scanner.unfixableGets.Map._M_h._M_buckets = (__buckets_ptr)_Var17._M_head_impl;
          scanner.unfixableGets.Map._M_h._M_bucket_count = (size_type)auStack_78;
          wasm::Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                    ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)auStack_1d8,
                     wasm::PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::scan,
                     (Expression **)
                     (*(long *)&((_Var17._M_head_impl)->name).super_IString.str + 0x40));
          while (((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                  (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                        _M_elems[9].currp >> 4) +
                 (long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                       super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep != 0) {
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar13 = 
                "T &wasm::SmallVector<wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, 10>::back() [T = wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, N = 10]"
                ;
LAB_001439eb:
                __assert_fail("usedFixed > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                              ,0x7e,pcVar13);
              }
              pTVar19 = (pointer)&scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems
                                  [(long)scanner.
                                         super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                         .
                                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                         .replacep + -2].currp;
            }
            else {
              pTVar19 = scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start + -1;
            }
            peVar7 = (element_type *)pTVar19->currp;
            if ((pointer)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                         super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                         _M_elems[9].currp ==
                scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep ==
                  (Expression **)0x0) {
                pcVar13 = 
                "void wasm::SmallVector<wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, 10>::pop_back() [T = wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::Task, N = 10]"
                ;
LAB_001439cc:
                __assert_fail("usedFixed > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                              ,0x75,pcVar13);
              }
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep =
                   (Expression **)
                   ((long)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep + -1
                   );
            }
            else {
              scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
              super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                   super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
                   super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
            }
            auStack_1d8 = (undefined1  [8])peVar7;
            if ((Expression *)(peVar7->tag).super_IString.str._M_len == (Expression *)0x0) {
              pcVar13 = 
              "void wasm::Walker<InitFixer, wasm::Visitor<InitFixer>>::walk(Expression *&) [SubType = InitFixer, VisitorType = wasm::Visitor<InitFixer>]"
              ;
LAB_0014397f:
              __assert_fail("*task.currp",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                            ,0x132,pcVar13);
            }
            (*pTVar19->func)((InitScanner *)auStack_1d8,(Expression **)peVar7);
          }
          local_90[0] = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)auStack_78;
          std::
          _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                    ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)auStack_78,((_Var17._M_head_impl)->name).super_IString.str._M_len,local_90);
          if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].
              currp != (Expression **)0x0) {
            operator_delete(scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            fixed._M_elems[9].currp,
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .flexible.
                                  super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems[9].currp);
          }
        }
        _Var17._M_head_impl = (Export *)&((_Var17._M_head_impl)->name).super_IString.str._M_str;
      } while (_Var17._M_head_impl != _Var9._M_head_impl);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_78);
    std::__cxx11::
    _List_base<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>,_std::allocator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>
    ::_M_clear(&local_1f0);
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::_List_iterator<std::pair<const_wasm::Name,_wasm::InsertOrderedSet<wasm::Name>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&global.super_IString.str._M_str);
    std::
    vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ::~vector(&local_a8);
  }
  return;
}

Assistant:

void applyToModule() {
    clearApplyState();

    // If nothing was ever written to memories then there is nothing to update.
    if (!memories.empty()) {
      applyMemoryToModule();
    }

    applyGlobalsToModule();
  }